

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void ImGui::AlignTextToFramePadding(void)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ImGuiWindow *pIVar4;
  undefined8 uVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  ImGuiContext *pIVar8;
  
  pIVar8 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  pIVar4->WriteAccessed = true;
  if (pIVar4->SkipItems == false) {
    fVar1 = (pIVar8->Style).FramePadding.y;
    auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),ZEXT416((uint)fVar1),
                             ZEXT416((uint)pIVar8->FontSize));
    fVar2 = (pIVar4->DC).CurrLineSize.y;
    fVar3 = (pIVar4->DC).CurrLineTextBaseOffset;
    uVar5 = vcmpss_avx512f(auVar7,ZEXT416((uint)fVar2),2);
    bVar6 = (bool)((byte)uVar5 & 1);
    (pIVar4->DC).CurrLineSize.y = (float)((uint)bVar6 * (int)fVar2 + (uint)!bVar6 * auVar7._0_4_);
    uVar5 = vcmpss_avx512f(ZEXT416((uint)fVar1),ZEXT416((uint)fVar3),2);
    bVar6 = (bool)((byte)uVar5 & 1);
    (pIVar4->DC).CurrLineTextBaseOffset =
         (float)((uint)bVar6 * (int)fVar3 + (uint)!bVar6 * (int)fVar1);
  }
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindow()          { ImGuiContext& g = *GImGui; g.CurrentWindow->WriteAccessed = true; return g.CurrentWindow; }